

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

int __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::AddSSRC(SDES *this,uint32_t ssrc)

{
  uint32_t s_00;
  RTPMemoryManager *pRVar1;
  SDESSource *this_00;
  iterator local_48;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_40 [3];
  SDESSource *local_28;
  SDESSource *s;
  SDES *pSStack_18;
  uint32_t ssrc_local;
  SDES *this_local;
  
  s._4_4_ = ssrc;
  pSStack_18 = this;
  pRVar1 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
  this_00 = (SDESSource *)operator_new(0x38,pRVar1,0x1f);
  s_00 = s._4_4_;
  pRVar1 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
  SDESSource::SDESSource(this_00,s_00,pRVar1);
  if (this_00 == (SDESSource *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    local_28 = this_00;
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
    ::push_back(&this->sdessources,&local_28);
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
         ::end(&this->sdessources);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
    _List_const_iterator(local_40,&local_48);
    (this->sdesit)._M_node = local_40[0]._M_node;
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::operator--
              (&this->sdesit,0);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int AddSSRC(uint32_t ssrc)
		{
			SDESSource *s = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_SDESSOURCE) SDESSource(ssrc,GetMemoryManager());
			if (s == 0)
				return ERR_RTP_OUTOFMEM;
			sdessources.push_back(s);
			sdesit = sdessources.end();
			sdesit--;
			return 0;
		}